

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool tinyusdz::is_identity(matrix4d *m)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  
  dVar1 = m->m[0][0];
  if (-1 < (long)dVar1) {
    uVar3 = (long)dVar1 + 0xc010000000000000;
    uVar2 = -uVar3;
    if (0 < (long)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar2 < 2) {
      dVar1 = m->m[0][1];
      if ((long)dVar1 < 0) {
        if (ABS(dVar1) != 0.0) {
          return false;
        }
      }
      else if (1 < (ulong)dVar1) {
        return false;
      }
      dVar1 = m->m[0][2];
      if ((long)dVar1 < 0) {
        if (ABS(dVar1) != 0.0) {
          return false;
        }
      }
      else if (1 < (ulong)dVar1) {
        return false;
      }
      dVar1 = m->m[0][3];
      if ((long)dVar1 < 0) {
        if (ABS(dVar1) != 0.0) {
          return false;
        }
      }
      else if (1 < (ulong)dVar1) {
        return false;
      }
      dVar1 = m->m[1][0];
      if ((long)dVar1 < 0) {
        if (ABS(dVar1) != 0.0) {
          return false;
        }
      }
      else if (1 < (ulong)dVar1) {
        return false;
      }
      dVar1 = m->m[1][1];
      if (-1 < (long)dVar1) {
        uVar3 = (long)dVar1 + 0xc010000000000000;
        uVar2 = -uVar3;
        if (0 < (long)uVar3) {
          uVar2 = uVar3;
        }
        if (uVar2 < 2) {
          dVar1 = m->m[1][2];
          if ((long)dVar1 < 0) {
            if (ABS(dVar1) != 0.0) {
              return false;
            }
          }
          else if (1 < (ulong)dVar1) {
            return false;
          }
          dVar1 = m->m[1][3];
          if ((long)dVar1 < 0) {
            if (ABS(dVar1) != 0.0) {
              return false;
            }
          }
          else if (1 < (ulong)dVar1) {
            return false;
          }
          dVar1 = m->m[2][0];
          if ((long)dVar1 < 0) {
            if (ABS(dVar1) != 0.0) {
              return false;
            }
          }
          else if (1 < (ulong)dVar1) {
            return false;
          }
          dVar1 = m->m[2][1];
          if ((long)dVar1 < 0) {
            if (ABS(dVar1) != 0.0) {
              return false;
            }
          }
          else if (1 < (ulong)dVar1) {
            return false;
          }
          dVar1 = m->m[2][2];
          if (-1 < (long)dVar1) {
            uVar3 = (long)dVar1 + 0xc010000000000000;
            uVar2 = -uVar3;
            if (0 < (long)uVar3) {
              uVar2 = uVar3;
            }
            if (uVar2 < 2) {
              dVar1 = m->m[2][3];
              if ((long)dVar1 < 0) {
                if (ABS(dVar1) != 0.0) {
                  return false;
                }
              }
              else if (1 < (ulong)dVar1) {
                return false;
              }
              dVar1 = m->m[3][0];
              if ((long)dVar1 < 0) {
                if (ABS(dVar1) != 0.0) {
                  return false;
                }
              }
              else if (1 < (ulong)dVar1) {
                return false;
              }
              dVar1 = m->m[3][1];
              if ((long)dVar1 < 0) {
                if (ABS(dVar1) != 0.0) {
                  return false;
                }
              }
              else if (1 < (ulong)dVar1) {
                return false;
              }
              dVar1 = m->m[3][2];
              if ((long)dVar1 < 0) {
                if (ABS(dVar1) != 0.0) {
                  return false;
                }
              }
              else if (1 < (ulong)dVar1) {
                return false;
              }
              dVar1 = m->m[3][3];
              if (-1 < (long)dVar1) {
                uVar3 = (long)dVar1 + 0xc010000000000000;
                uVar2 = -uVar3;
                if (0 < (long)uVar3) {
                  uVar2 = uVar3;
                }
                return uVar2 < 2;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix4d &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][1], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][2], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][3], 1.0, uint64_t(kIdentityMaxUlps));
}